

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTypeHandler.cpp
# Opt level: O3

DynamicType * __thiscall
Js::PathTypeHandlerBase::PromoteType
          (PathTypeHandlerBase *this,DynamicObject *instance,PathTypeSuccessorKey key,
          PropertyIndex *propertyIndex)

{
  ScriptContext *scriptContext;
  DynamicTypeHandler *newTypeHandler;
  DynamicType *pDVar1;
  
  pDVar1 = (DynamicType *)(instance->super_RecyclableObject).type.ptr;
  scriptContext =
       (((pDVar1->super_Type).javascriptLibrary.ptr)->super_JavascriptLibraryBase).scriptContext.ptr
  ;
  pDVar1 = PromoteType<false>(this,pDVar1,key,false,scriptContext,instance,propertyIndex);
  newTypeHandler = (pDVar1->typeHandler).ptr;
  DynamicObject::EnsureSlots
            (instance,(this->super_DynamicTypeHandler).slotCapacity,newTypeHandler->slotCapacity,
             scriptContext,newTypeHandler);
  DynamicTypeHandler::ReplaceInstanceType(instance,pDVar1);
  return pDVar1;
}

Assistant:

DynamicType* PathTypeHandlerBase::PromoteType(DynamicObject* instance, const PathTypeSuccessorKey key, PropertyIndex* propertyIndex)
    {
        ScriptContext* scriptContext = instance->GetScriptContext();
        DynamicType* currentType = instance->GetDynamicType();

        DynamicType* nextType = this->PromoteType<false>(currentType, key, false, scriptContext, instance, propertyIndex);
        PathTypeHandlerBase* nextPath = (PathTypeHandlerBase*) nextType->GetTypeHandler();

        instance->EnsureSlots(this->GetSlotCapacity(), nextPath->GetSlotCapacity(), scriptContext, nextType->GetTypeHandler());

        ReplaceInstanceType(instance, nextType);
        return nextType;
    }